

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O2

float root(float x)

{
  ostream *poVar1;
  float fVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"sqrt (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (0.0 <= x) {
    return SQRT(x);
  }
  fVar2 = sqrtf(x);
  return fVar2;
}

Assistant:

float
root (float x)
{
    std::cout << "sqrt (" << x << ")" << std::endl;
    return sqrt (x);
}